

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParserNsUpdateSax(xmlParserCtxtPtr ctxt,xmlChar *prefix,void *saxData)

{
  int iVar1;
  int iVar2;
  xmlHashedString local_28;
  
  iVar2 = -1;
  if (ctxt->str_xml != prefix) {
    local_28.name = prefix;
    if (prefix == (xmlChar *)0x0) {
      local_28.hashValue = 0;
    }
    else {
      local_28.hashValue = xmlDictComputeHash(ctxt->dict,prefix);
    }
    iVar1 = xmlParserNsLookup(ctxt,&local_28,(xmlParserNsBucket **)0x0);
    if ((iVar1 != 0x7fffffff) && (ctxt->nsdb->minNsIndex <= iVar1)) {
      ctxt->nsdb->extra[iVar1].saxData = saxData;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
xmlParserNsUpdateSax(xmlParserCtxtPtr ctxt, const xmlChar *prefix,
                     void *saxData) {
    xmlHashedString hprefix;
    int nsIndex;

    if (prefix == ctxt->str_xml)
        return(-1);

    hprefix.name = prefix;
    if (prefix != NULL)
        hprefix.hashValue = xmlDictComputeHash(ctxt->dict, prefix);
    else
        hprefix.hashValue = 0;
    nsIndex = xmlParserNsLookup(ctxt, &hprefix, NULL);
    if ((nsIndex == INT_MAX) || (nsIndex < ctxt->nsdb->minNsIndex))
        return(-1);

    ctxt->nsdb->extra[nsIndex].saxData = saxData;
    return(0);
}